

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall duckdb::WriteAheadLog::WriteVersion(WriteAheadLog *this)

{
  pointer this_00;
  idx_t iVar1;
  type stream;
  WALType local_580 [8];
  undefined1 local_578 [8];
  _Alloc_hider _Stack_570;
  size_type local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_560;
  idx_t iStack_550;
  undefined8 local_548;
  BinarySerializer serializer;
  
  this_00 = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
            ::operator->(&this->writer);
  iVar1 = BufferedFileWriter::GetFileSize(this_00);
  if (iVar1 == 0) {
    stream = unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
             ::operator*(&this->writer);
    local_578[0] = false;
    local_578[1] = false;
    local_578._2_6_ = 0;
    _Stack_570._M_p = (pointer)0x0;
    local_568 = 0;
    aStack_560._M_allocated_capacity = 0;
    aStack_560._8_8_ = 0;
    iStack_550 = 0;
    local_548._0_1_ = false;
    local_548._1_7_ = 0;
    SerializationOptions::SerializationOptions((SerializationOptions *)local_578);
    BinarySerializer::BinarySerializer
              (&serializer,&stream->super_WriteStream,(SerializationOptions *)local_578);
    ::std::__cxx11::string::~string((string *)&_Stack_570);
    BinarySerializer::OnObjectBegin(&serializer);
    local_580[0] = 0x62;
    Serializer::WriteProperty<duckdb::WALType>
              (&serializer.super_Serializer,100,"wal_type",local_580);
    local_580[0] = DROP_TABLE;
    local_580[1] = INVALID;
    local_580[2] = INVALID;
    local_580[3] = INVALID;
    local_580[4] = INVALID;
    local_580[5] = INVALID;
    local_580[6] = INVALID;
    local_580[7] = INVALID;
    Serializer::WriteProperty<unsigned_long>
              (&serializer.super_Serializer,0x65,"version",(unsigned_long *)local_580);
    BinarySerializer::OnObjectEnd(&serializer);
    BinarySerializer::~BinarySerializer(&serializer);
  }
  return;
}

Assistant:

void WriteAheadLog::WriteVersion() {
	D_ASSERT(writer);
	if (writer->GetFileSize() > 0) {
		// already written - no need to write a version marker
		return;
	}
	// write the version marker
	// note that we explicitly do not checksum the version entry
	BinarySerializer serializer(*writer);
	serializer.Begin();
	serializer.WriteProperty(100, "wal_type", WALType::WAL_VERSION);
	serializer.WriteProperty(101, "version", idx_t(WAL_VERSION_NUMBER));
	serializer.End();
}